

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

void __thiscall InsertProxyModelPrivate::afterSort(InsertProxyModelPrivate *this,bool isRow)

{
  qsizetype *this_00;
  int iVar1;
  undefined4 uVar2;
  InsertProxyModel *pIVar3;
  Int IVar4;
  long *plVar5;
  const_reference pQVar6;
  reference this_01;
  InsertDirection flags;
  int local_198;
  undefined4 local_16c;
  int local_13c;
  QModelIndex local_130;
  QModelIndex local_118;
  QModelIndex local_100;
  int local_e8;
  int local_e4;
  int newSortedIdx;
  int i;
  QModelIndexList toList;
  QModelIndex local_b0;
  undefined4 local_84;
  undefined1 local_80 [4];
  int maxSecondaryIdx;
  QList<QMap<int,_QVariant>_> oldlayout;
  Int local_60;
  QFlags<InsertProxyModel::InsertDirection> local_5c;
  InsertDirections directionCheck;
  QModelIndex local_40;
  int local_24;
  InsertProxyModel *pIStack_20;
  int maxSortedIdx;
  InsertProxyModel *q;
  InsertProxyModelPrivate *pIStack_10;
  bool isRow_local;
  InsertProxyModelPrivate *this_local;
  
  q._7_1_ = isRow;
  pIStack_10 = this;
  pIStack_20 = q_func(this);
  if ((q._7_1_ & 1) == 0) {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffa8);
    local_13c = (**(code **)(*plVar5 + 0x80))(plVar5,&stack0xffffffffffffffa8);
  }
  else {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    QModelIndex::QModelIndex(&local_40);
    local_13c = (**(code **)(*plVar5 + 0x78))(plVar5,&local_40);
  }
  local_24 = local_13c;
  flags = InsertRow;
  if ((q._7_1_ & 1) != 0) {
    flags = InsertColumn;
  }
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_5c,flags);
  oldlayout.d.size._4_4_ = local_5c.i;
  local_60 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                            (&this->m_insertDirection,local_5c);
  IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_60);
  if (IVar4 != 0) {
    QList<QMap<int,_QVariant>_>::QList
              ((QList<QMap<int,_QVariant>_> *)local_80,this->m_extraData + ((q._7_1_ ^ 0xff) & 1));
    if ((q._7_1_ & 1) == 0) {
      plVar5 = (long *)QAbstractProxyModel::sourceModel();
      this_00 = &toList.d.size;
      QModelIndex::QModelIndex((QModelIndex *)this_00);
      local_16c = (**(code **)(*plVar5 + 0x78))(plVar5,this_00);
    }
    else {
      plVar5 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex(&local_b0);
      local_16c = (**(code **)(*plVar5 + 0x80))(plVar5,&local_b0);
    }
    local_84 = local_16c;
    QList<QModelIndex>::QList((QList<QModelIndex> *)&newSortedIdx);
    QList<QModelIndex>::reserve((QList<QModelIndex> *)&newSortedIdx,(long)local_24);
    for (local_e4 = 0; local_e4 < local_24; local_e4 = local_e4 + 1) {
      if ((q._7_1_ & 1) == 0) {
        QList<QPersistentModelIndex>::at(&this->m_layoutChangeExtraPersistentIndexes,(long)local_e4)
        ;
        local_198 = QPersistentModelIndex::column();
      }
      else {
        QList<QPersistentModelIndex>::at(&this->m_layoutChangeExtraPersistentIndexes,(long)local_e4)
        ;
        local_198 = QPersistentModelIndex::row();
      }
      local_e8 = local_198;
      pQVar6 = QList<QMap<int,_QVariant>_>::at
                         ((QList<QMap<int,_QVariant>_> *)local_80,(long)local_e4);
      this_01 = QList<QMap<int,_QVariant>_>::operator[]
                          (this->m_extraData + ((byte)~q._7_1_ & 1),(long)local_e8);
      QMap<int,_QVariant>::operator=(this_01,pQVar6);
      pIVar3 = pIStack_20;
      uVar2 = local_84;
      iVar1 = local_e8;
      if ((q._7_1_ & 1) == 0) {
        QModelIndex::QModelIndex(&local_130);
        (**(code **)(*(long *)pIVar3 + 0x60))(&local_100,pIVar3,uVar2,iVar1,&local_130);
      }
      else {
        QModelIndex::QModelIndex(&local_118);
        (**(code **)(*(long *)pIVar3 + 0x60))(&local_100,pIVar3,iVar1,uVar2,&local_118);
      }
      QList<QModelIndex>::operator<<((QList<QModelIndex> *)&newSortedIdx,&local_100);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict2 *)pIStack_20,
               (QList_conflict2 *)&this->m_layoutChangeExtraProxyIndexes);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)&newSortedIdx);
    QList<QMap<int,_QVariant>_>::~QList((QList<QMap<int,_QVariant>_> *)local_80);
  }
  QList<QModelIndex>::clear(&this->m_layoutChangeExtraProxyIndexes);
  QList<QPersistentModelIndex>::clear(&this->m_layoutChangeExtraPersistentIndexes);
  return;
}

Assistant:

void InsertProxyModelPrivate::afterSort(bool isRow)
{
    Q_Q(InsertProxyModel);
    const int maxSortedIdx = isRow ? q->sourceModel()->rowCount() : q->sourceModel()->columnCount();
    const InsertProxyModel::InsertDirections directionCheck = isRow ? InsertProxyModel::InsertColumn : InsertProxyModel::InsertRow;
    if (m_insertDirection & directionCheck) {
        const auto oldlayout = m_extraData[!isRow];
        const int maxSecondaryIdx = isRow ? q->sourceModel()->columnCount() : q->sourceModel()->rowCount();
        QModelIndexList toList;
        toList.reserve(maxSortedIdx);
        Q_ASSERT(m_layoutChangeExtraPersistentIndexes.size() == maxSortedIdx);
        for (int i = 0; i < maxSortedIdx; ++i) {
            const int newSortedIdx = isRow ? m_layoutChangeExtraPersistentIndexes.at(i).row() : m_layoutChangeExtraPersistentIndexes.at(i).column();
            m_extraData[!isRow][newSortedIdx] = oldlayout.at(i);
            toList << (isRow ? q->index(newSortedIdx, maxSecondaryIdx) : q->index(maxSecondaryIdx, newSortedIdx));
        }
        q->changePersistentIndexList(m_layoutChangeExtraProxyIndexes, toList);
    }
    m_layoutChangeExtraProxyIndexes.clear();
    m_layoutChangeExtraPersistentIndexes.clear();
}